

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O2

Byte * z7_BranchConv_ARM64_Enc(Byte *data,SizeT size,UInt32 pc)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = 0;
  do {
    if ((size & 0xfffffffffffffffc) == uVar2) {
      return data + (size & 0xfffffffffffffffc);
    }
    uVar3 = *(uint *)(data + uVar2);
    if ((uVar3 & 0xfc000000) == 0x94000000) {
      uVar3 = uVar3 + (pc + (int)uVar2 >> 2) & 0x3ffffff | 0x94000000;
LAB_00140a79:
      *(uint *)(data + uVar2) = uVar3;
    }
    else if (((uVar3 + 0x70000000 & 0x9f000000) == 0) &&
            (uVar1 = uVar3 + 0x70100000, (uVar1 & 0xe00000) == 0)) {
      uVar1 = (uVar1 >> 0x1a | uVar1 & 0xff1fffe0) + (pc + (int)uVar2 >> 0xc) * 8;
      uVar3 = (uVar1 & 0x1fffe0) + 0xf00000 & 0xffffe0 | uVar1 * 0x4000000 | uVar3 & 0x1f |
              0x90000000;
      goto LAB_00140a79;
    }
    uVar2 = uVar2 + 4;
  } while( true );
}

Assistant:

Z7_BRANCH_FUNC_MAIN(BranchConv_ARM64)
{
  // Byte *p = data;
  const Byte *lim;
  const UInt32 flag = (UInt32)1 << (24 - 4);
  const UInt32 mask = ((UInt32)1 << 24) - (flag << 1);
  size &= ~(SizeT)3;
  // if (size == 0) return p;
  lim = p + size;
  BR_PC_INIT
  pc -= 4;  // because (p) will point to next instruction
  
  BR_EXTERNAL_FOR
  {
    // Z7_PRAGMA_OPT_DISABLE_LOOP_UNROLL_VECTORIZE
    for (;;)
    {
      UInt32 v;
      if Z7_UNLIKELY(p == lim)
        return p;
      v = GetUi32a(p);
      p += 4;
      if Z7_UNLIKELY(((v - 0x94000000) & 0xfc000000) == 0)
      {
        UInt32 c = BR_PC_GET >> 2;
        BR_CONVERT_VAL(v, c)
        v &= 0x03ffffff;
        v |= 0x94000000;
        SetUi32a(p - 4, v)
        BR_NEXT_ITERATION
      }
      // v = rotlFixed(v, 8);  v += (flag << 8) - 0x90;  if Z7_UNLIKELY((v & ((mask << 8) + 0x9f)) == 0)
      v -= 0x90000000;  if Z7_UNLIKELY((v & 0x9f000000) == 0)
      {
        UInt32 z, c;
        // v = rotrFixed(v, 8);
        v += flag; if Z7_UNLIKELY(v & mask) continue;
        z = (v & 0xffffffe0) | (v >> 26);
        c = (BR_PC_GET >> (12 - 3)) & ~(UInt32)7;
        BR_CONVERT_VAL(z, c)
        v &= 0x1f;
        v |= 0x90000000;
        v |= z << 26;
        v |= 0x00ffffe0 & ((z & (((flag << 1) - 1))) - flag);
        SetUi32a(p - 4, v)
      }
    }
  }
}